

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

TreeEnsembleParameters_TreeNode * __thiscall
CoreML::TreeEnsembleBase::_getNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,bool is_setup_routine)

{
  TreeEnsembleParameters *this_00;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  logic_error *plVar4;
  bool local_3ea;
  string local_3e8 [32];
  ostringstream local_3c8 [8];
  ostringstream ss_1;
  pair<unsigned_long,_unsigned_long> local_248;
  pair<const_std::pair<unsigned_long,_unsigned_long>,_int> local_238;
  const_iterator local_220;
  TreeEnsembleParameters_TreeNode *local_218;
  TreeEnsembleParameters_TreeNode *newNode;
  int new_node_index;
  ostringstream local_1d8 [8];
  ostringstream ss;
  pair<unsigned_long,_unsigned_long> local_60;
  _Self local_50;
  pair<unsigned_long,_unsigned_long> local_48;
  _Self local_38;
  iterator it;
  size_t sStack_28;
  bool is_setup_routine_local;
  size_t nodeId_local;
  size_t treeId_local;
  TreeEnsembleBase *this_local;
  
  it._M_node._7_1_ = is_setup_routine;
  sStack_28 = nodeId;
  nodeId_local = treeId;
  treeId_local = (size_t)this;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            (&local_48,&nodeId_local,&stack0xffffffffffffffd8);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_long,_unsigned_long>,_int,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>_>
       ::lower_bound(&this->_nodeId_map,&local_48);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_long,_unsigned_long>,_int,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>_>
       ::end(&this->_nodeId_map);
  bVar1 = std::operator==(&local_38,&local_50);
  local_3ea = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>
             ::operator->(&local_38);
    local_60 = std::make_pair<unsigned_long&,unsigned_long&>(&nodeId_local,&stack0xffffffffffffffd8)
    ;
    local_3ea = std::operator!=(&ppVar2->first,&local_60);
  }
  if (local_3ea == false) {
    if ((it._M_node._7_1_ & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_3c8);
      poVar3 = std::operator<<((ostream *)local_3c8,
                               "Setup routine called multiple times for treeId=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,nodeId_local);
      poVar3 = std::operator<<(poVar3,", nodeID=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sStack_28);
      std::operator<<(poVar3,".");
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::logic_error::logic_error(plVar4,local_3e8);
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this_00 = this->tree_parameters;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>
             ::operator->(&local_38);
    this_local = (TreeEnsembleBase *)
                 Specification::TreeEnsembleParameters::mutable_nodes(this_00,ppVar2->second);
  }
  else {
    if ((it._M_node._7_1_ & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar3 = std::operator<<((ostream *)local_1d8,
                               "Setup routine not called yet for node with treeId=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,nodeId_local);
      poVar3 = std::operator<<(poVar3,", nodeID=");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sStack_28);
      std::operator<<(poVar3,".");
      newNode._7_1_ = 1;
      plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::logic_error::logic_error(plVar4,(string *)&new_node_index);
      newNode._7_1_ = 0;
      __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    newNode._0_4_ = Specification::TreeEnsembleParameters::nodes_size(this->tree_parameters);
    local_218 = Specification::TreeEnsembleParameters::add_nodes(this->tree_parameters);
    Specification::TreeEnsembleParameters_TreeNode::set_treeid(local_218,nodeId_local);
    Specification::TreeEnsembleParameters_TreeNode::set_nodeid(local_218,sStack_28);
    std::_Rb_tree_const_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>::
    _Rb_tree_const_iterator(&local_220,&local_38);
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              (&local_248,&nodeId_local,&stack0xffffffffffffffd8);
    std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>::pair<int_&,_true>
              (&local_238,&local_248,(int *)&newNode);
    std::
    map<std::pair<unsigned_long,_unsigned_long>,_int,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>_>
    ::insert(&this->_nodeId_map,local_220,&local_238);
    this_local = (TreeEnsembleBase *)local_218;
  }
  return (TreeEnsembleParameters_TreeNode *)this_local;
}

Assistant:

Specification::TreeEnsembleParameters_TreeNode& TreeEnsembleBase::_getNode(size_t treeId, size_t nodeId, bool is_setup_routine) {
        auto it = _nodeId_map.lower_bound({treeId, nodeId});

        if(it == _nodeId_map.end() || it->first != std::make_pair(treeId, nodeId)) {
            if(!is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine not called yet for node with treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }

            int new_node_index = tree_parameters->nodes_size();
            Specification::TreeEnsembleParameters_TreeNode* newNode = tree_parameters->add_nodes();
            newNode->set_treeid(treeId);
            newNode->set_nodeid(nodeId);
            _nodeId_map.insert(it, {{treeId, nodeId}, new_node_index});
            return *newNode;
        } else {
            if(is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine called multiple times for treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }
            return *(tree_parameters->mutable_nodes(it->second));
        }
    }